

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_and_exp(SyntaxAnalyze *this)

{
  undefined8 uVar1;
  undefined8 this_00;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ExpressNode *this_01;
  element_type *peVar4;
  uint uVar5;
  pointer pWVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  SyntaxAnalyze *in_RSI;
  SharedExNdPtr SVar8;
  SharedExNdPtr father;
  string tmpName;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  undefined1 local_e8 [32];
  SyntaxAnalyze *local_c8;
  size_t *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  SharedExNdPtr local_a8;
  SharedExNdPtr local_98;
  SharedExNdPtr local_88;
  undefined1 local_78 [32];
  irGenerator *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  local_c8 = this;
  gm_eq_exp((SyntaxAnalyze *)local_e8);
  *(undefined8 *)this = local_e8._0_8_;
  this->matched_index = local_e8._8_8_;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(in_RSI->matched_index + 1);
  pWVar6 = (in_RSI->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (((long)(in_RSI->word_list->
                        super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pWVar6 >> 4) *
                -0x5555555555555555);
  if (p_Var3 < _Var7._M_pi) {
    local_c0 = &this->matched_index;
    local_58 = &in_RSI->irGenerator;
    do {
      bVar2 = word::Word::match_token(pWVar6 + (long)p_Var3,AND);
      _Var7._M_pi = extraout_RDX;
      if (!bVar2) break;
      this_01 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(this_01);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                (&local_f0,this_01);
      this_01->_operation = OR;
      match_one_word(in_RSI,AND);
      gm_eq_exp((SyntaxAnalyze *)local_e8);
      this_00 = local_e8._8_8_;
      uVar1 = local_e8._0_8_;
      peVar4 = *(element_type **)this;
      if ((peVar4->_type == CNS) &&
         (*(int *)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                   local_e8._0_8_)->_M_ptr == 0)) {
        this_01->_type = CNS;
        if (peVar4->_value == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)(*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_e8._0_8_ + 8))->_M_pi != 0);
        }
        this_01->_value = uVar5;
      }
      else {
        local_e8._0_8_ = local_e8 + 0x10;
        local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8[0x10] = 0;
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_((string *)&local_50,local_58,Int);
        std::__cxx11::string::operator=((string *)local_e8,(string *)local_50._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_allocated_capacity != &local_40) {
          operator_delete((void *)local_50._M_allocated_capacity,
                          (ulong)(local_40._M_allocated_capacity + 1));
        }
        this = local_c8;
        this_01->_type = VAR;
        std::__cxx11::string::_M_assign((string *)&this_01->_name);
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,local_e8._0_8_,
                   (undefined1 *)
                   ((long)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                           local_e8._0_8_)->_M_ptr + (long)(_func_int ***)local_e8._8_8_));
        local_88.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(element_type **)this;
        local_88.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
        if (local_88.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_88.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_88.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_88.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_88.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_98.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)uVar1;
        local_98.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
          }
        }
        hp_gn_binary_mir(in_RSI,(string *)local_78,&local_88,&local_98,And);
        if (local_98.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_88.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_78._0_8_ != (element_type *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
        if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
        }
        peVar4 = *(element_type **)this;
      }
      local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_c0;
      if (local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar4;
      express::ExpressNode::addChild(this_01,&local_a8);
      if (local_a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_b8._M_allocated_capacity = uVar1;
      local_b8._8_8_ = this_00;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
        }
      }
      express::ExpressNode::addChild(this_01,(SharedExNdPtr *)&local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      *(ExpressNode **)this = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c0,&local_f0);
      if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(in_RSI->matched_index + 1);
      pWVar6 = (in_RSI->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((long)(in_RSI->word_list->
                            super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar6 >> 4) *
                    -0x5555555555555555);
    } while (p_Var3 < _Var7._M_pi);
  }
  SVar8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  SVar8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_and_exp() {
  SharedExNdPtr first;
  first = gm_eq_exp();

  while (try_word(1, Token::AND)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    father->_operation = OperationType::OR;

    match_one_word(Token::AND);
    op = Op::And;

    second = gm_eq_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      father->_value = first->_value && second->_value;
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }
    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}